

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basictests.cpp
# Opt level: O2

void test32<19u>(void)

{
  uint uVar1;
  ostream *poVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"(32-bit) testing ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  uVar6 = 1;
  while( true ) {
    uVar5 = (uint)uVar6;
    if (uVar5 == 0) {
      return;
    }
    uVar3 = uVar6 * 0xd79435e5 + 0xd79435e5;
    uVar4 = uVar3 & 0xfffffffff;
    uVar7 = (int)(uVar6 / 0x13) * -0x13 + uVar5;
    uVar8 = (uint)(uVar6 / 0x13);
    uVar9 = (uint)(uVar3 >> 0x24);
    uVar1 = (uint)(uVar4 * 0x13 >> 0x20);
    if ((((uVar7 == 0) != uVar4 < 0xd79435e5) || (uVar8 != uVar9)) || (uVar7 != uVar1 >> 4)) break;
    uVar6 = (ulong)(uVar5 + 1);
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"problem with n = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar5);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"quotient: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar9);
  poVar2 = std::operator<<(poVar2," expected: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar8);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"remainder: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar1 >> 4);
  poVar2 = std::operator<<(poVar2," expected: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)(uVar6 / 0x13) * -0x13 + uVar5);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"multiple: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar4 < 0xd79435e5);
  poVar2 = std::operator<<(poVar2," expected: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar7 == 0);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"need_fallback = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,true);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"is_power_2    = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,false);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"c             = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xd79435e5);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"leading_zeroes= ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x1b);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"log2_divisor  = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,4);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"m             = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x1000000000);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"overflow      = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,false);
  std::endl<char,std::char_traits<char>>(poVar2);
  abort();
}

Assistant:

void test32() {
  std::cout << "(32-bit) testing " << divisor << std::endl;
  for (uint32_t n = 1; n != 0; n++) {
    bool quotient_ok =
        fast_division::divide32<divisor>::quotient(n) == n / divisor;
    bool remainder_ok =
        fast_division::divide32<divisor>::remainder(n) == n % divisor;
    bool mult_ok =
        fast_division::divide32<divisor>::is_divisible(n) == (n % divisor == 0);
    if (!quotient_ok || !remainder_ok || !mult_ok) {
      std::cerr << "problem with n = " << n << std::endl;
      std::cout << "quotient: " << fast_division::divide32<divisor>::quotient(n)
                << " expected: " << n / divisor << std::endl;
      std::cout << "remainder: "
                << fast_division::divide32<divisor>::remainder(n)
                << " expected: " << n % divisor << std::endl;
      std::cout << "multiple: "
                << fast_division::divide32<divisor>::is_divisible(n)
                << " expected: " << (n % divisor == 0) << std::endl;

      std::cout << "need_fallback = "
                << fast_division::divide32<divisor>::need_fallback << std::endl;
      std::cout << "is_power_2    = "
                << fast_division::divide32<divisor>::is_power_2 << std::endl;
      std::cout << "c             = " << fast_division::divide32<divisor>::c
                << std::endl;
      std::cout << "leading_zeroes= "
                << fast_division::divide32<divisor>::leading_zeroes
                << std::endl;
      std::cout << "log2_divisor  = "
                << fast_division::divide32<divisor>::log2_divisor << std::endl;
      std::cout << "m             = " << fast_division::divide32<divisor>::m
                << std::endl;
      std::cout << "overflow      = "
                << fast_division::divide32<divisor>::overflow << std::endl;

      abort();
    }
  }
}